

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalWatcomWMakeGenerator::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalWatcomWMakeGenerator *this)

{
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const override
  {
    return cmGlobalWatcomWMakeGenerator::GetActualName();
  }